

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

Subtree ts_subtree_new_error
                  (SubtreePool *pool,int32_t lookahead_char,Length padding,Length size,
                  uint32_t bytes_scanned,TSStateId parse_state,TSLanguage *language)

{
  Subtree SVar1;
  SubtreeHeapData *data;
  int32_t lookahead_char_local;
  SubtreePool *pool_local;
  Length size_local;
  Length padding_local;
  Subtree result;
  
  SVar1 = ts_subtree_new_leaf(pool,0xffff,padding,size,bytes_scanned,parse_state,false,false,
                              language);
  *(ushort *)&(SVar1.ptr)->field_0x2c = *(ushort *)&(SVar1.ptr)->field_0x2c & 0xfff7 | 8;
  *(ushort *)&(SVar1.ptr)->field_0x2c = *(ushort *)&(SVar1.ptr)->field_0x2c & 0xffef | 0x10;
  ((SVar1.ptr)->field_17).lookahead_char = lookahead_char;
  return (Subtree)SVar1.data;
}

Assistant:

Subtree ts_subtree_new_error(
  SubtreePool *pool, int32_t lookahead_char, Length padding, Length size,
  uint32_t bytes_scanned, TSStateId parse_state, const TSLanguage *language
) {
  Subtree result = ts_subtree_new_leaf(
    pool, ts_builtin_sym_error, padding, size, bytes_scanned,
    parse_state, false, false, language
  );
  SubtreeHeapData *data = (SubtreeHeapData *)result.ptr;
  data->fragile_left = true;
  data->fragile_right = true;
  data->lookahead_char = lookahead_char;
  return result;
}